

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O0

int __thiscall XPMP2::TCPConnection::listen(TCPConnection *this,int __fd,int __n)

{
  int iVar1;
  undefined8 uVar2;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  string *in_stack_ffffffffffffffd8;
  NetRuntimeError *in_stack_ffffffffffffffe0;
  
  iVar1 = ::listen((this->super_SocketNetworking).f_socket,__fd);
  if (iVar1 < 0) {
    uVar3 = 1;
    uVar2 = __cxa_allocate_exception(0x50);
    std::operator+((char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                   in_stack_ffffffffffffff90);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar3,in_stack_ffffffffffffff58),(char *)this);
    std::__cxx11::to_string(in_stack_ffffffffffffff9c);
    std::operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    NetRuntimeError::NetRuntimeError(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    __cxa_throw(uVar2,&NetRuntimeError::typeinfo,NetRuntimeError::~NetRuntimeError);
  }
  return iVar1;
}

Assistant:

void TCPConnection::listen (int numConnections)
{
    if (::listen(f_socket, numConnections) < 0)
        throw NetRuntimeError("Can't listen on socket " + f_addr + ":" + std::to_string(f_port));
}